

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  _Bind<void_(EventLoopThread::*(EventLoopThread_*))()> local_78;
  ThreadFunc local_60;
  string local_40;
  allocator local_19;
  
  this->loop_ = (EventLoop *)0x0;
  this->exiting_ = false;
  local_78._M_f = (offset_in_EventLoopThread_to_subr)threadFunc;
  local_78._8_8_ = 0;
  local_78._M_bound_args.super__Tuple_impl<0UL,_EventLoopThread_*>.
  super__Head_base<0UL,_EventLoopThread_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_EventLoopThread_*>)(_Tuple_impl<0UL,_EventLoopThread_*>)this;
  std::function<void()>::function<std::_Bind<void(EventLoopThread::*(EventLoopThread*))()>,void>
            ((function<void()> *)&local_60,&local_78);
  std::__cxx11::string::string((string *)&local_40,"EventLoopThread",&local_19);
  Thread::Thread(&this->thread_,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  MutexLock::MutexLock(&this->mutex_);
  Condition::Condition(&this->cond_,&this->mutex_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
    : loop_(NULL),
      exiting_(false),
      thread_(std::bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
      mutex_(),
      cond_(mutex_) {
}